

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biftrc(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  runsdef *prVar2;
  voccxdef *pvVar3;
  int iVar4;
  byte bVar5;
  runsdef val;
  runsdef rStack_18;
  
  prVar1 = ctx->bifcxrun;
  if (argc == 2) {
    prVar2 = prVar1->runcxsp;
    prVar1->runcxsp = prVar2 + -1;
    prVar1 = ctx->bifcxrun;
    if (prVar2[-1].runstyp != '\x01') {
      prVar1->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    prVar2 = prVar1->runcxsp;
    iVar4 = *(int *)&prVar2->runsv;
    prVar1->runcxsp = prVar2 + -1;
    if ((prVar2[-1].runstyp != '\b') && (ctx->bifcxrun->runcxsp->runstyp != '\x05')) {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ed);
    }
    if (iVar4 != 1) {
      ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "debugTrace";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x400);
    }
    pvVar3 = ctx->bifcxrun->runcxvoc;
    bVar5 = pvVar3->voccxflg;
    if (prVar2[-1].runstyp == '\b') {
      bVar5 = bVar5 | 4;
    }
    else {
      bVar5 = bVar5 & 0xfb;
    }
    pvVar3->voccxflg = bVar5;
  }
  else {
    iVar4 = dbgstart(prVar1->runcxdbg);
    runpush(prVar1,(uint)(iVar4 != 0) * 3 + 5,&rStack_18);
  }
  return;
}

Assistant:

void biftrc(bifcxdef *ctx, int argc)
{
    runsdef val;
    int     n;
    int     flag;

    if (argc == 2)
    {
        /* get the type indicator and the on/off status */
        n = runpopnum(ctx->bifcxrun);
        flag = runpoplog(ctx->bifcxrun);

        /* see what type of debugging they want to turn on or off */
        switch(n)
        {
        case 1:
            /* turn on parser tracing */
            if (flag)
                ctx->bifcxrun->runcxvoc->voccxflg |= VOCCXFDBG;
            else
                ctx->bifcxrun->runcxvoc->voccxflg &= ~VOCCXFDBG;
            break;

        default:
            /* ignore other requests */
            runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "debugTrace");
        }
    }
    else
    {
        /* break into debugger; return whether debugger is present */
        bifcntargs(ctx, 0, argc);
        runpush(ctx->bifcxrun, runclog(dbgstart(ctx->bifcxrun->runcxdbg)),
                &val);
    }
}